

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall
cppjieba::DictTrie::CreateTrie
          (DictTrie *this,vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *dictUnits
          )

{
  size_type sVar1;
  vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> *pvVar2;
  void *pvVar3;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_RSI;
  value_type *in_RDI;
  size_t i;
  vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> valuePointers;
  vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
  words;
  value_type *in_stack_ffffffffffffff88;
  const_reference in_stack_ffffffffffffffa0;
  vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
  *in_stack_ffffffffffffffb0;
  vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> *this_00;
  vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> *keys;
  Trie *in_stack_ffffffffffffffc0;
  
  sVar1 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::size(in_RSI);
  if (sVar1 != 0) {
    std::
    vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>::
    vector((vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
            *)0x152953);
    std::vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>::vector
              ((vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> *)
               0x15295d);
    this_00 = (vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> *)0x0
    ;
    while( true ) {
      keys = this_00;
      pvVar2 = (vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> *)
               std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::size(in_RSI);
      if (pvVar2 <= this_00) break;
      std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::operator[]
                (in_RSI,(size_type)keys);
      std::
      vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
      ::push_back((vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
                   *)in_stack_ffffffffffffffa0,in_RDI);
      in_stack_ffffffffffffffa0 =
           std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::operator[]
                     (in_RSI,(size_type)keys);
      std::vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>::
      push_back(this_00,in_stack_ffffffffffffff88);
      this_00 = (vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> *)
                ((long)&(keys->
                        super__Vector_base<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    pvVar3 = operator_new(8);
    Trie::Trie(in_stack_ffffffffffffffc0,
               (vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
                *)keys,in_stack_ffffffffffffffb0);
    *(void **)(in_RDI[1].buffer_ + 4) = pvVar3;
    std::vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_>::~vector
              ((vector<const_cppjieba::DictUnit_*,_std::allocator<const_cppjieba::DictUnit_*>_> *)
               in_stack_ffffffffffffffa0);
    std::
    vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>::
    ~vector((vector<limonp::LocalVector<unsigned_int>,_std::allocator<limonp::LocalVector<unsigned_int>_>_>
             *)in_stack_ffffffffffffffa0);
    return;
  }
  __assert_fail("dictUnits.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/messense[P]cppjieba-cabi/cppjieba/include/cppjieba/DictTrie.hpp"
                ,0xae,"void cppjieba::DictTrie::CreateTrie(const vector<DictUnit> &)");
}

Assistant:

void CreateTrie(const vector<DictUnit>& dictUnits) {
    assert(dictUnits.size());
    vector<Unicode> words;
    vector<const DictUnit*> valuePointers;
    for (size_t i = 0 ; i < dictUnits.size(); i ++) {
      words.push_back(dictUnits[i].word);
      valuePointers.push_back(&dictUnits[i]);
    }

    trie_ = new Trie(words, valuePointers);
  }